

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O1

Maybe<int> __thiscall capnp::getSendBufferSize(capnp *this,AsyncIoStream *stream)

{
  int bufSize;
  uint len;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  NullableValue<kj::Exception> _exception467;
  undefined4 local_520;
  uint local_51c;
  Fault local_518;
  DebugComparison<unsigned_int_&,_unsigned_long> local_510 [31];
  
  local_520 = 0;
  local_51c = 4;
  (*(stream->super_AsyncInputStream)._vptr_AsyncInputStream[8])(stream,1,7,&local_520,&local_51c);
  local_510[0].result = local_51c == 4;
  local_510[0].right = 4;
  local_510[0].op.content.ptr = " == ";
  local_510[0].op.content.size_ = 5;
  if (!local_510[0].result) {
    local_510[0].left = &local_51c;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_518,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
               ,0x1d2,FAILED,"len == sizeof(bufSize)","_kjCondition,",local_510);
    kj::_::Debug::Fault::~Fault(&local_518);
  }
  *this = (capnp)0x1;
  *(undefined4 *)(this + 4) = local_520;
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getSendBufferSize(kj::AsyncIoStream& stream) {
  // TODO(perf): It might be nice to have a tryGetsockopt() that doesn't require catching
  //   exceptions?
  int bufSize = 0;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    uint len = sizeof(int);
    stream.getsockopt(SOL_SOCKET, SO_SNDBUF, &bufSize, &len);
    KJ_ASSERT(len == sizeof(bufSize)) { break; }
  })) {
    if (exception.getType() != kj::Exception::Type::UNIMPLEMENTED) {
      // TODO(someday): Figure out why getting SO_SNDBUF sometimes throws EINVAL. I suspect it
      //   happens when the remote side has closed their read end, meaning we no longer have
      //   a send buffer, but I don't know what is the best way to verify that that was actually
      //   the reason. I'd prefer not to ignore EINVAL errors in general.

      // kj::throwRecoverableException(kj::mv(exception));
    }
    return kj::none;
  }
  return bufSize;
}